

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O3

void __thiscall CSocekt::flyd_wait_request_handler(CSocekt *this,lp_connection_t c)

{
  char *pcVar1;
  uint uVar2;
  ulong v;
  LogStream *pLVar3;
  char **ppcVar4;
  char *pcVar5;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  Logger LStack_ff8;
  
  if (muduo::g_logLevel < 3) {
    file._8_8_ = 0x16;
    file.data_ = "flyd_socket_request.cc";
    muduo::Logger::Logger(&LStack_ff8,file,0x18);
    if (0x28 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,
                      "调用了flyd_wait_request_handler函数",0x28);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0x28;
    }
    muduo::Logger::~Logger(&LStack_ff8);
  }
  v = recvproc(this,c,c->precvbuf,(ulong)c->irecvlen);
  if (muduo::g_logLevel < 3) {
    file_00._8_8_ = 0x16;
    file_00.data_ = "flyd_socket_request.cc";
    muduo::Logger::Logger(&LStack_ff8,file_00,0x1c);
    if (9 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"要接收",9);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 9;
    }
    pLVar3 = muduo::LogStream::operator<<(&LStack_ff8.impl_.stream_,c->irecvlen);
    ppcVar4 = &(pLVar3->buffer_).cur_;
    pcVar1 = (pLVar3->buffer_).cur_;
    if (6 < (uint)((int)ppcVar4 - (int)pcVar1)) {
      builtin_strncpy(pcVar1,"字节",6);
      pcVar1 = *ppcVar4;
      pcVar5 = pcVar1 + 6;
      *ppcVar4 = pcVar5;
      if (6 < (uint)((int)ppcVar4 - (int)pcVar5)) {
        builtin_strncpy(pcVar1 + 6,"收到",6);
        *ppcVar4 = *ppcVar4 + 6;
      }
    }
    pLVar3 = muduo::LogStream::operator<<(pLVar3,v);
    ppcVar4 = &(pLVar3->buffer_).cur_;
    pcVar1 = (pLVar3->buffer_).cur_;
    if (6 < (uint)((int)ppcVar4 - (int)pcVar1)) {
      builtin_strncpy(pcVar1,"字节",6);
      *ppcVar4 = *ppcVar4 + 6;
    }
    muduo::Logger::~Logger(&LStack_ff8);
  }
  if ((long)v < 1) {
    return;
  }
  switch(c->curStat) {
  case '\0':
    if (v != this->m_iLenPkgHeader) {
      if (muduo::g_logLevel < 3) {
        file_03._8_8_ = 0x16;
        file_03.data_ = "flyd_socket_request.cc";
        muduo::Logger::Logger(&LStack_ff8,file_03,0x2c);
        if ((((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_ & 0xfffffff0U)
            != 0) {
          builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"包头不完整",0xf);
          LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0xf;
        }
        muduo::Logger::~Logger(&LStack_ff8);
      }
      c->curStat = '\x01';
      c->precvbuf = c->precvbuf + v;
      c->irecvlen = c->irecvlen - (int)v;
      return;
    }
    if (muduo::g_logLevel < 3) {
      file_01._8_8_ = 0x16;
      file_01.data_ = "flyd_socket_request.cc";
      muduo::Logger::Logger(&LStack_ff8,file_01,0x27);
      if ((((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_ & 0xfffffff0U) !=
          0) {
        builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"完整的包头",0xf);
        LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0xf;
      }
      muduo::Logger::~Logger(&LStack_ff8);
    }
    break;
  case '\x01':
    if (muduo::g_logLevel < 3) {
      file_02._8_8_ = 0x16;
      file_02.data_ = "flyd_socket_request.cc";
      muduo::Logger::Logger(&LStack_ff8,file_02,0x35);
      if (0x12 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"接收包头中...",0x12);
        LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0x12;
      }
      muduo::Logger::~Logger(&LStack_ff8);
    }
    uVar2 = c->irecvlen;
    if (v != uVar2) {
      c->curStat = '\x01';
      goto LAB_00114fe6;
    }
    break;
  case '\x02':
    uVar2 = c->irecvlen;
    if (v == uVar2) {
LAB_00114eed:
      flyd_wait_request_handler_proc_plast(this,c);
      return;
    }
    c->curStat = '\x03';
    goto LAB_00114fe6;
  case '\x03':
    uVar2 = c->irecvlen;
    if (v == uVar2) goto LAB_00114eed;
LAB_00114fe6:
    c->precvbuf = c->precvbuf + v;
    c->irecvlen = uVar2 - (int)v;
  default:
    goto switchD_00114e52_default;
  }
  flyd_wait_request_handler_proc_p1(this,c);
switchD_00114e52_default:
  return;
}

Assistant:

void CSocekt::flyd_wait_request_handler(lp_connection_t c)
{
    LOG_INFO << "调用了flyd_wait_request_handler函数";
    //收包，注意我们用的第二个和第三个参数，我们用的始终是这两个参数，因此我们必须保证 c->precvbuf指向正确的收包位置，保证c->irecvlen指向正确的收包宽度
    
    ssize_t reco = recvproc(c,c->precvbuf,c->irecvlen);
    LOG_INFO << "要接收" << c->irecvlen << "字节" << "收到" << reco << "字节";
    if(reco <= 0)
    {
        return;//该处理的上边这个recvproc()函数处理过了，这里<=0是直接return
    }

    //走到这里，说明成功收到了一些字节（>0），就要开始判断收到了多少数据了
    if(c->curStat == _PKG_HD_INIT) //连接建立起来时肯定是这个状态，因为在ngx_get_connection()中已经把curStat成员赋值成_PKG_HD_INIT了
    {
        if(reco == m_iLenPkgHeader)//正好收到完整包头，这里拆解包头
        {
            LOG_INFO << "完整的包头";
            flyd_wait_request_handler_proc_p1(c); //那就调用专门针对包头处理完整的函数去处理把。
        }
        else
        {
             LOG_INFO << "包头不完整";
            //收到的包头不完整--我们不能预料每个包的长度，也不能预料各种拆包/粘包情况，所以收到不完整包头【也算是缺包】是很可能的；
            c->curStat        = _PKG_HD_RECVING;                 //接收包头中，包头不完整，继续接收包头中
            c->precvbuf       = c->precvbuf + reco;              //注意收后续包的内存往后走
            c->irecvlen       = c->irecvlen - reco;              //要收的内容当然要减少，以确保只收到完整的包头先
        } //end  if(reco == m_iLenPkgHeader)
    }
    else if(c->curStat == _PKG_HD_RECVING) //接收包头中，包头不完整，继续接收中，这个条件才会成立
    {
        LOG_INFO << "接收包头中...";
        if(c->irecvlen == reco) //要求收到的宽度和我实际收到的宽度相等
        {
            //包头收完整了
            flyd_wait_request_handler_proc_p1(c); //那就调用专门针对包头处理完整的函数去处理把。
        }
        else
        {
            //包头还是没收完整，继续收包头
            c->curStat        = _PKG_HD_RECVING;                 //没必要
            c->precvbuf       = c->precvbuf + reco;              //注意收后续包的内存往后走
            c->irecvlen       = c->irecvlen - reco;              //要收的内容当然要减少，以确保只收到完整的包头先
        }
    }
    else if(c->curStat == _PKG_BD_INIT)
    {
        //包头刚好收完，准备接收包体
        if(reco == c->irecvlen)
        {
            //收到的宽度等于要收的宽度，包体也收完整了
            flyd_wait_request_handler_proc_plast(c);
        }
        else
        {
            //收到的宽度小于要收的宽度
            c->curStat = _PKG_BD_RECVING;
            c->precvbuf = c->precvbuf + reco;
            c->irecvlen = c->irecvlen - reco;
        }
    }
    else if(c->curStat == _PKG_BD_RECVING)
    {
        //接收包体中，包体不完整，继续接收中
        if(c->irecvlen == reco)
        {
            //包体收完整了
            flyd_wait_request_handler_proc_plast(c);
        }
        else
        {
            //包体没收完整，继续收
            c->precvbuf = c->precvbuf + reco;
            c->irecvlen = c->irecvlen - reco;
        }
    }  //end if(c->curStat == _PKG_HD_INIT)

}